

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O3

int __thiscall Peers::connect(Peers *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SocketResource peer;
  int iVar1;
  Socket __fd_00;
  tuple<Peer_*,_std::default_delete<Peer>_> this_00;
  undefined8 extraout_RAX;
  long lVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  char *pcVar4;
  ostream *poVar5;
  SocketResource socket;
  sockaddr_in addr;
  SocketResource local_3c;
  __uniq_ptr_impl<Peer,_std::default_delete<Peer>_> local_38;
  __uniq_ptr_impl<Peer,_std::default_delete<Peer>_> local_30;
  sockaddr local_28;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  if ((uint)__addr < 1000) {
    poVar5 = (ostream *)&std::cout;
    pcVar4 = "Invalid remote peer port\n";
    lVar2 = 0x19;
  }
  else {
    local_3c = SocketResource::create();
    local_28.sa_family = 2;
    local_28.sa_data._0_2_ = (ushort)__addr << 8 | (ushort)__addr >> 8;
    iVar1 = inet_pton(2,(char *)*puVar3,local_28.sa_data + 2);
    if (iVar1 < 1) {
      poVar5 = (ostream *)&std::cout;
      pcVar4 = "Peers: Invalid IPv4 host address\n";
      lVar2 = 0x21;
    }
    else {
      __fd_00 = SocketResource::resource(&local_3c);
      iVar1 = ::connect(__fd_00,&local_28,0x10);
      peer.m_socket = local_3c.m_socket;
      if (iVar1 == 0) {
        this_00.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
        super__Head_base<0UL,_Peer_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>)operator_new(0x50);
        Peer::Peer((Peer *)this_00.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                           super__Head_base<0UL,_Peer_*,_false>._M_head_impl,this->m_p2pSocket,peer,
                   0);
        local_30._M_t.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
        super__Head_base<0UL,_Peer_*,_false>._M_head_impl =
             (tuple<Peer_*,_std::default_delete<Peer>_>)
             (_Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>)0x0;
        local_38._M_t.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
        super__Head_base<0UL,_Peer_*,_false>._M_head_impl =
             (tuple<Peer_*,_std::default_delete<Peer>_>)
             (tuple<Peer_*,_std::default_delete<Peer>_>)
             this_00.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
             super__Head_base<0UL,_Peer_*,_false>._M_head_impl;
        peerIsConnected(this,(unique_ptr<Peer,_std::default_delete<Peer>_> *)&local_38);
        std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr
                  ((unique_ptr<Peer,_std::default_delete<Peer>_> *)&local_38);
        std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr
                  ((unique_ptr<Peer,_std::default_delete<Peer>_> *)&local_30);
        return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Peer connection to ",0x13);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," on port ",9);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      pcVar4 = " failed";
      lVar2 = 7;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar2);
  return 0;
}

Assistant:

bool Peers::connect(const std::string &remotePeerAddr, uint16_t port)
{
    if (port < 0x3E8 || port > 0xFFFF) {
        std::cout << "Invalid remote peer port\n";
        return false;
    }
    auto socket = SocketResource::create();

    sockaddr_in addr;
    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);
#ifdef _WIN32
    auto ipAddr = ::inet_addr(remotePeerAddr.c_str());
    if (ipAddr == INADDR_NONE)
        return false;
    if (ipAddr == INADDR_ANY)
        return false;
    address.sin_addr.s_addr = ipAddr;
#else
    if (::inet_pton(AF_INET, remotePeerAddr.c_str(), &addr.sin_addr) <= 0) {
        std::cout << "Peers: Invalid IPv4 host address\n";
        return false;
    }
#endif
    if (::connect(socket.resource(), (struct sockaddr *)&addr, sizeof(addr)) != NO_ERROR) {
        std::cout << "Peer connection to " << remotePeerAddr << " on port " << port << " failed";
        return false;
    }

    std::unique_ptr<Peer> peer = std::make_unique<Peer>(m_p2pSocket, SocketResource(socket), 0);
    peerIsConnected(std::move(peer));
    return true;
}